

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void ctemplate::EmitModifiedString
               (vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                *modifiers,char *in,size_t inlen,PerExpandData *data,ExpandEmitter *outbuf)

{
  char *pcVar1;
  TemplateModifier *pTVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  string output_of_this_modifier;
  string result;
  StringEmitter scratchbuf2;
  StringEmitter scratchbuf;
  string value_string;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  value_string._M_dataplus._M_p = (pointer)&value_string.field_2;
  value_string._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  value_string.field_2._M_local_buf[0] = '\0';
  pMVar4 = (modifiers->
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (modifiers->
           super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)pMVar3 - (long)pMVar4) / 0x18)) {
    std::__cxx11::string::reserve((ulong)&result);
    scratchbuf.super_ExpandEmitter._vptr_ExpandEmitter = (_func_int **)&PTR__ExpandEmitter_00153330;
    pMVar4 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = pMVar4->value;
    output_of_this_modifier._M_dataplus._M_p = (pointer)&output_of_this_modifier.field_2;
    scratchbuf.outbuf_ = &result;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&output_of_this_modifier,pcVar1,pcVar1 + pMVar4->value_len);
    std::__cxx11::string::operator=((string *)&value_string,(string *)&output_of_this_modifier);
    std::__cxx11::string::~string((string *)&output_of_this_modifier);
    pTVar2 = ((modifiers->
              super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
              )._M_impl.super__Vector_impl_data._M_start)->modifier_info->modifier;
    (**pTVar2->_vptr_TemplateModifier)(pTVar2,in,inlen,data,&scratchbuf,&value_string);
    pMVar4 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      pMVar5 = pMVar4 + 1;
      pMVar3 = (modifiers->
               super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pMVar5 == pMVar3 + -1) break;
      output_of_this_modifier._M_dataplus._M_p = (pointer)&output_of_this_modifier.field_2;
      output_of_this_modifier._M_string_length = 0;
      output_of_this_modifier.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::reserve((ulong)&output_of_this_modifier);
      scratchbuf2.super_ExpandEmitter._vptr_ExpandEmitter =
           (_func_int **)&PTR__ExpandEmitter_00153330;
      local_50[0] = local_40;
      scratchbuf2.outbuf_ = &output_of_this_modifier;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,pMVar4[1].value,pMVar4[1].value + pMVar4[1].value_len);
      std::__cxx11::string::operator=((string *)&value_string,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      pTVar2 = pMVar5->modifier_info->modifier;
      (**pTVar2->_vptr_TemplateModifier)
                (pTVar2,result._M_dataplus._M_p,result._M_string_length,data,&scratchbuf2,
                 &value_string);
      std::__cxx11::string::swap((string *)&result);
      std::__cxx11::string::~string((string *)&output_of_this_modifier);
      pMVar4 = pMVar5;
    }
    pMVar4 = (modifiers->
             super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    inlen = result._M_string_length;
    in = result._M_dataplus._M_p;
  }
  if (pMVar4 != pMVar3) {
    output_of_this_modifier._M_dataplus._M_p = (pointer)&output_of_this_modifier.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&output_of_this_modifier,pMVar3[-1].value,
               pMVar3[-1].value + pMVar3[-1].value_len);
    std::__cxx11::string::operator=((string *)&value_string,(string *)&output_of_this_modifier);
    std::__cxx11::string::~string((string *)&output_of_this_modifier);
    pTVar2 = ((modifiers->
              super__Vector_base<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
              )._M_impl.super__Vector_impl_data._M_finish[-1].modifier_info)->modifier;
    (**pTVar2->_vptr_TemplateModifier)(pTVar2,in,inlen,data,outbuf,&value_string);
    std::__cxx11::string::~string((string *)&value_string);
    std::__cxx11::string::~string((string *)&result);
    return;
  }
  __assert_fail("!modifiers.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x36d,
                "void ctemplate::EmitModifiedString(const vector<ModifierAndValue> &, const char *, size_t, const PerExpandData *, ExpandEmitter *)"
               );
}

Assistant:

static void EmitModifiedString(const vector<ModifierAndValue>& modifiers,
                               const char* in, size_t inlen,
                               const PerExpandData* data,
                               ExpandEmitter* outbuf) {
  string result;
  string value_string;
  if (modifiers.size() > 1) {
    // If there's more than one modifiers, we need to store the
    // intermediate results in a temp-buffer.  We use a string.
    // We'll assume that each modifier adds about 12% to the input
    // size.
    result.reserve((inlen + inlen/8) + 16);
    StringEmitter scratchbuf(&result);
    value_string = string(modifiers.front().value, modifiers.front().value_len);
    modifiers.front().modifier_info->modifier->Modify(in, inlen, data,
                                                      &scratchbuf,
                                                      value_string);
    // Only used when modifiers.size() > 2
    for (vector<ModifierAndValue>::const_iterator it = modifiers.begin() + 1;
         it != modifiers.end()-1;  ++it) {
      string output_of_this_modifier;
      output_of_this_modifier.reserve(result.size() + result.size()/8 + 16);
      StringEmitter scratchbuf2(&output_of_this_modifier);
      value_string = string(it->value, it->value_len);
      it->modifier_info->modifier->Modify(result.c_str(), result.size(), data,
                                          &scratchbuf2, value_string);
      result.swap(output_of_this_modifier);
    }
    in = result.data();
    inlen = result.size();
  }
  // For the last modifier, we can write directly into outbuf
  assert(!modifiers.empty());
  value_string = string(modifiers.back().value, modifiers.back().value_len);
  modifiers.back().modifier_info->modifier->Modify(in, inlen, data, outbuf,
                                                   value_string);
}